

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *__return_storage_ptr__,string *s,char delim,size_t max_splits)

{
  size_t sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type local_40;
  size_t delim_offset;
  size_t token_start_offset;
  size_type local_28;
  size_t max_splits_local;
  string *psStack_18;
  char delim_local;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  token_start_offset._7_1_ = 0;
  local_28 = max_splits;
  max_splits_local._7_1_ = delim;
  psStack_18 = s;
  s_local = (string *)__return_storage_ptr__;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  delim_offset = 0;
  while( true ) {
    sVar1 = delim_offset;
    sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (psStack_18);
    if (sVar2 < sVar1) {
      return __return_storage_ptr__;
    }
    if ((local_28 == 0) ||
       (sVar3 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(__return_storage_ptr__), sVar3 != local_28)) {
      local_b0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      psStack_18,max_splits_local._7_1_,delim_offset);
    }
    else {
      local_b0 = 0xffffffffffffffff;
    }
    local_40 = local_b0;
    if (local_b0 == 0xffffffffffffffff) break;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,psStack_18,delim_offset,local_b0 - delim_offset);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    delim_offset = local_40 + 1;
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_60,psStack_18,delim_offset,0xffffffffffffffff);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

vector<string> split(const string& s, char delim, size_t max_splits) {
  vector<string> ret;

  // Note: token_start_offset can be equal to s.size() if the string ends with
  // the delimiter character; in that case, we need to ensure we correctly
  // return an empty string at the end of ret.
  size_t token_start_offset = 0;
  while (token_start_offset <= s.size()) {
    size_t delim_offset = (max_splits && (ret.size() == max_splits))
        ? string::npos
        : s.find(delim, token_start_offset);
    if (delim_offset == string::npos) {
      ret.emplace_back(s.substr(token_start_offset));
      break;
    } else {
      ret.emplace_back(s.substr(token_start_offset, delim_offset - token_start_offset));
      token_start_offset = delim_offset + 1;
    }
  }
  return ret;
}